

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::clear(CmdLine *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  CmdLine *in_RDI;
  
  arguments(in_RDI);
  cVar1 = std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::begin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                   *)in_RDI);
  arguments(in_RDI);
  cVar2 = std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::end((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                 *)in_RDI);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::clear()::_lambda(auto:1_const&)_1_>
            (cVar1._M_current,cVar2._M_current);
  in_RDI->m_command = (Command *)0x0;
  in_RDI->m_currCommand = (Command *)0x0;
  std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::clear
            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)0x145766);
  return;
}

Assistant:

void clear()
	{
		std::for_each( arguments().begin(), arguments().end(),
			[] ( const auto & a ) { a->clear(); } );

		m_command = nullptr;
		m_currCommand = nullptr;
		m_prevCommand.clear();
	}